

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

int __thiscall BinGE<0,_0,_1>::checkSatisfied(BinGE<0,_0,_1> *this)

{
  bool bVar1;
  int iVar2;
  
  if ((this->super_Propagator).satisfied.v == '\0') {
    bVar1 = BoolView::isFalse(&this->r);
    if (bVar1) {
      iVar2 = 1;
    }
    else {
      iVar2 = 3;
      if ((((this->x).var)->min).v < (((this->y).var)->max).v) {
        return 3;
      }
    }
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int checkSatisfied() override {
		if (satisfied) {
			return 1;
		}
		if (r.isFalse()) {
			satisfied = true;
			return 1;
		}
		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}
		return 3;
	}